

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O3

Iterator<false> * __thiscall
bitdeque<32768>::Iterator<false>::operator+=(Iterator<false> *this,difference_type dist)

{
  long lVar1;
  _Map_pointer ppbVar2;
  int iVar3;
  _Elt_pointer pbVar4;
  long lVar5;
  _Elt_pointer pbVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  difference_type __node_offset;
  long lVar10;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dist < 1) {
    if (-1 < dist) goto LAB_0046c80a;
    lVar5 = -dist;
    iVar3 = this->m_bitpos;
    uVar9 = (ulong)iVar3;
    pbVar4 = (this->m_it)._M_cur;
    pbVar6 = (this->m_it)._M_first;
    if (-uVar9 != dist && (long)uVar9 <= lVar5) {
      if (pbVar4 == pbVar6) {
        ppbVar2 = (this->m_it)._M_node;
        (this->m_it)._M_node = ppbVar2 + -1;
        pbVar6 = ppbVar2[-1];
        (this->m_it)._M_first = pbVar6;
        pbVar4 = pbVar6 + 1;
        (this->m_it)._M_last = pbVar4;
      }
      pbVar4 = pbVar4 + -1;
      (this->m_it)._M_cur = pbVar4;
      lVar5 = lVar5 + ~uVar9;
      iVar3 = 0x7fff;
    }
    lVar8 = lVar5 + 0x7fff;
    if (-1 < lVar5) {
      lVar8 = lVar5;
    }
    lVar8 = lVar8 >> 0xf;
    lVar10 = ((long)pbVar4 - (long)pbVar6 >> 0xc) - lVar8;
    if (lVar10 == 0) {
      pbVar4 = pbVar4 + -lVar8;
    }
    else {
      ppbVar2 = (this->m_it)._M_node + lVar10;
      (this->m_it)._M_node = ppbVar2;
      pbVar4 = *ppbVar2;
      (this->m_it)._M_first = pbVar4;
      (this->m_it)._M_last = pbVar4 + 1;
    }
    (this->m_it)._M_cur = pbVar4;
    iVar7 = (int)lVar8 * 0x8000 - (int)lVar5;
  }
  else {
    iVar3 = this->m_bitpos;
    pbVar4 = (this->m_it)._M_cur;
    if (0x7fff < iVar3 + dist) {
      pbVar4 = pbVar4 + 1;
      (this->m_it)._M_cur = pbVar4;
      if (pbVar4 == (this->m_it)._M_last) {
        ppbVar2 = (this->m_it)._M_node;
        (this->m_it)._M_node = ppbVar2 + 1;
        pbVar4 = ppbVar2[1];
        (this->m_it)._M_first = pbVar4;
        (this->m_it)._M_last = pbVar4 + 1;
        (this->m_it)._M_cur = pbVar4;
      }
      dist = dist + iVar3 + -0x8000;
      iVar3 = 0;
    }
    lVar5 = dist + 0x7fff;
    if (-1 < dist) {
      lVar5 = dist;
    }
    lVar5 = lVar5 >> 0xf;
    lVar8 = ((long)pbVar4 - (long)(this->m_it)._M_first >> 0xc) + lVar5;
    if (lVar8 == 0) {
      pbVar4 = pbVar4 + lVar5;
    }
    else {
      ppbVar2 = (this->m_it)._M_node + lVar8;
      (this->m_it)._M_node = ppbVar2;
      pbVar4 = *ppbVar2;
      (this->m_it)._M_first = pbVar4;
      (this->m_it)._M_last = pbVar4 + 1;
    }
    (this->m_it)._M_cur = pbVar4;
    iVar7 = (int)dist + (int)lVar5 * -0x8000;
  }
  this->m_bitpos = iVar7 + iVar3;
LAB_0046c80a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

Iterator& operator+=(difference_type dist)
        {
            if (dist > 0) {
                if (dist + m_bitpos >= BITS_PER_WORD) {
                    ++m_it;
                    dist -= BITS_PER_WORD - m_bitpos;
                    m_bitpos = 0;
                }
                auto jump = dist / BITS_PER_WORD;
                m_it += jump;
                m_bitpos += dist - jump * BITS_PER_WORD;
            } else if (dist < 0) {
                dist = -dist;
                if (dist > m_bitpos) {
                    --m_it;
                    dist -= m_bitpos + 1;
                    m_bitpos = BITS_PER_WORD - 1;
                }
                auto jump = dist / BITS_PER_WORD;
                m_it -= jump;
                m_bitpos -= dist - jump * BITS_PER_WORD;
            }
            return *this;
        }